

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::FFlux
          (MLABecLaplacian *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location param_6,int face_only)

{
  Geometry *this_00;
  FabArray<amrex::FArrayBox> *in_RDI;
  int ncomp;
  Real *dxinv;
  Box *box;
  int mglev;
  int in_stack_00000564;
  FArrayBox *in_stack_00000568;
  Array<FArrayBox_*,_3> *in_stack_00000570;
  Array<const_FArrayBox_*,_3> *in_stack_00000578;
  Real in_stack_00000580;
  Real *in_stack_00000588;
  Box *in_stack_00000590;
  int in_stack_00001970;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  MFIter *in_stack_ffffffffffffffc0;
  
  MFIter::tilebox(in_stack_ffffffffffffffc0);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_RDI,
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  CoordSys::InvCellSize(&this_00->super_CoordSys);
  (**(code **)((long)(((_Vector_impl_data *)
                      &(((MultiFab *)&in_RDI->super_FabArrayBase)->super_FabArray<amrex::FArrayBox>)
                       .super_FabArrayBase._vptr_FabArrayBase)->_M_start->super_CoordSys).dx + 8))()
  ;
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  FabArray<amrex::FArrayBox>::operator[]
            (in_RDI,(MFIter *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  FabArray<amrex::FArrayBox>::operator[]
            (in_RDI,(MFIter *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::array<amrex::MultiFab,_3UL>::operator[]
            ((array<amrex::MultiFab,_3UL> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  FabArray<amrex::FArrayBox>::operator[]
            (in_RDI,(MFIter *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  FFlux(in_stack_00000590,in_stack_00000588,in_stack_00000580,in_stack_00000578,in_stack_00000570,
        in_stack_00000568,in_stack_00000564,in_stack_00001970);
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (int amrlev, const MFIter& mfi,
                        const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                        const FArrayBox& sol, Location, const int face_only) const
{
    BL_PROFILE("MLABecLaplacian::FFlux()");

    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const int ncomp = getNComp();
    FFlux(box, dxinv, m_b_scalar,
          Array<FArrayBox const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&(m_b_coeffs[amrlev][mglev][0][mfi]),
                                                               &(m_b_coeffs[amrlev][mglev][1][mfi]),
                                                               &(m_b_coeffs[amrlev][mglev][2][mfi]))}},
          flux, sol, face_only, ncomp);
}